

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_check_visible(REF_CAVITY ref_cavity)

{
  uint uVar1;
  int local_2c;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL visible;
  REF_INT face;
  REF_INT node;
  REF_NODE ref_node;
  REF_CAVITY ref_cavity_local;
  
  _face = ref_cavity->ref_grid->node;
  visible = ref_cavity->node;
  ref_node = (REF_NODE)ref_cavity;
  if (_face->ref_mpi->id == _face->part[visible]) {
    if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
      for (ref_private_macro_code_rss = 0;
          ref_private_macro_code_rss < *(int *)((long)&ref_node->age + 4);
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if ((((-1 < ref_private_macro_code_rss) &&
             (ref_private_macro_code_rss < *(int *)((long)&ref_node->age + 4))) &&
            (*(int *)(*(long *)&ref_node->naux + (long)(ref_private_macro_code_rss * 3) * 4) != -1))
           && (((visible !=
                 *(int *)(*(long *)&ref_node->naux + (long)(ref_private_macro_code_rss * 3) * 4) &&
                (visible !=
                 *(int *)(*(long *)&ref_node->naux + (long)(ref_private_macro_code_rss * 3 + 1) * 4)
                )) && (visible !=
                       *(int *)(*(long *)&ref_node->naux +
                               (long)(ref_private_macro_code_rss * 3 + 2) * 4))))) {
          uVar1 = ref_cavity_visible((REF_CAVITY)ref_node,ref_private_macro_code_rss,&local_2c);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x7be,"ref_cavity_check_visible",(ulong)uVar1,"free");
            return uVar1;
          }
          if (local_2c == 0) {
            ref_node->n = 2;
            return 0;
          }
        }
      }
      ref_node->n = 1;
      ref_cavity_local._4_4_ = 0;
    }
    else {
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x7b3,
           "ref_cavity_check_visible","cavity part must own node");
    ref_cavity_local._4_4_ = 1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_check_visible(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT face;
  REF_BOOL visible;

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    RSS(ref_cavity_visible(ref_cavity, face, &visible), "free");
    if (!visible) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  return REF_SUCCESS;
}